

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

string * anon_unknown.dwarf_41187::unescape(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  string local_58 [7];
  char chr;
  string byte;
  ulong local_28;
  size_t i;
  string *input_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = 0;
  do {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= local_28) {
      return __return_storage_ptr__;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if ((*pcVar3 == '\\') && (uVar2 = std::__cxx11::string::length(), local_28 + 2 < uVar2)) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      iVar1 = isxdigit((int)*pcVar3);
      if (iVar1 == 0) goto LAB_00156f38;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      iVar1 = isxdigit((int)*pcVar3);
      if (iVar1 == 0) goto LAB_00156f38;
      std::__cxx11::string::substr((ulong)local_58,(ulong)input);
      local_28 = local_28 + 2;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      strtol(pcVar3,(char **)0x0,0x10);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      std::__cxx11::string::~string(local_58);
    }
    else {
LAB_00156f38:
      std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

std::string unescape(std::string input) {
  std::string output;
  for (size_t i = 0; i < input.length(); i++) {
    if ((input[i] == '\\') && (i + 2 < input.length()) &&
        isxdigit(input[i + 1]) && isxdigit(input[i + 2])) {
      std::string byte = input.substr(i + 1, 2);
      i += 2;
      char chr = (char)(int)strtol(byte.c_str(), nullptr, 16);
      output.push_back(chr);
    } else {
      output.push_back(input[i]);
    }
  }
  return output;
}